

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nordic_itch_handler.cc
# Opt level: O2

void __thiscall
helix::nasdaq::nordic_itch_handler::process_msg(nordic_itch_handler *this,itch_seconds *m)

{
  uint64_t uVar1;
  
  uVar1 = itch_uatoi(m->Second,5);
  this->time_sec = uVar1;
  return;
}

Assistant:

void nordic_itch_handler::process_msg(const itch_seconds* m)
{
    auto second = itch_uatoi(m->Second, 5);
    time_sec = second;
}